

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckClasses.cpp
# Opt level: O0

void __thiscall GrcManager::CalculateCollisionOctaboxes(GrcManager *this,GrcFont *pfont)

{
  Symbol this_00;
  reference this_01;
  GrcGlyphAttrMatrix *in_RDI;
  int n;
  GrpLineAndFile lnf;
  bool fShadow;
  bool fOverride;
  int munitPR;
  int nPR;
  GdlExpression *pexp;
  bool fComplex;
  GlyphBoundaries *in_stack_000000a0;
  utf16 wGid;
  int nAttrIdComplex;
  Symbol psymComplex;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeef;
  string *in_stack_fffffffffffffef0;
  int *pnPR;
  string *in_stack_fffffffffffffef8;
  allocator *this_02;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  bool *in_stack_ffffffffffffff28;
  GrpLineAndFile *in_stack_ffffffffffffff30;
  GrcSymbolTable *in_stack_ffffffffffffff38;
  long *local_a0;
  ushort local_92;
  allocator local_89;
  string local_88 [55];
  allocator local_51;
  string local_50 [56];
  GrcSymbolTableEntry *local_18;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"collision",&local_51);
  this_02 = &local_89;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"complexFit",this_02);
  GrcStructName::GrcStructName
            ((GrcStructName *)this_02,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  this_00 = GrcSymbolTable::FindSymbol
                      (in_stack_ffffffffffffff38,(GrcStructName *)in_stack_ffffffffffffff30);
  GrcStructName::~GrcStructName((GrcStructName *)0x136fef);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  local_18 = this_00;
  GrcSymbolTableEntry::InternalID(this_00);
  std::vector<GlyphBoundaries,_std::allocator<GlyphBoundaries>_>::resize
            ((vector<GlyphBoundaries,_std::allocator<GlyphBoundaries>_> *)in_stack_fffffffffffffef0,
             CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
  for (local_92 = 0; local_92 < *(ushort *)((long)&in_RDI[0xb].m_prgasgnx + 2);
      local_92 = local_92 + 1) {
    pnPR = (int *)&stack0xffffffffffffff28;
    GrpLineAndFile::GrpLineAndFile((GrpLineAndFile *)0x1370a0);
    GrcGlyphAttrMatrix::Get
              (in_RDI,(gid16)((ulong)this_02 >> 0x30),(int)this_02,(GdlExpression **)this_00,pnPR,
               (int *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8),
               (bool *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               in_stack_ffffffffffffff28,in_stack_ffffffffffffff30);
    if (local_a0 != (long *)0x0) {
      in_stack_fffffffffffffeef =
           (**(code **)(*local_a0 + 0x38))(local_a0,&stack0xffffffffffffff24,0);
    }
    this_01 = std::vector<GlyphBoundaries,_std::allocator<GlyphBoundaries>_>::operator[]
                        ((vector<GlyphBoundaries,_std::allocator<GlyphBoundaries>_> *)
                         &in_RDI[0x10].m_cGlyphIDs,(ulong)local_92);
    GlyphBoundaries::Initialize(this_01,local_92);
    std::vector<GlyphBoundaries,_std::allocator<GlyphBoundaries>_>::operator[]
              ((vector<GlyphBoundaries,_std::allocator<GlyphBoundaries>_> *)
               &in_RDI[0x10].m_cGlyphIDs,(ulong)local_92);
    GlyphBoundaries::OverlayGrid(in_stack_000000a0,(GrcFont *)pexp,nPR._3_1_);
    GrpLineAndFile::~GrpLineAndFile((GrpLineAndFile *)0x13728c);
  }
  return;
}

Assistant:

void GrcManager::CalculateCollisionOctaboxes(GrcFont * pfont)
{
	Symbol psymComplex = m_psymtbl->FindSymbol(GrcStructName("collision", "complexFit"));
	int nAttrIdComplex = psymComplex->InternalID();

	m_vgbdy.resize(m_wGlyphIDLim);
	for (utf16 wGid = 0; wGid < m_wGlyphIDLim; wGid++)
	{
		// The collision.complexFit attr tells whether the shape of this glyph is complex
		// enough to require a grid of octaboxes to represent its shape rather than a single
		// octabox.
		bool fComplex = false;
		GdlExpression * pexp;
		int nPR;
		int munitPR;
		bool fOverride, fShadow;
		GrpLineAndFile lnf;
		m_pgax->Get(wGid, nAttrIdComplex,
				&pexp, &nPR, &munitPR, &fOverride, &fShadow, &lnf);
		if (!pexp)
			fComplex = false;
		else
		{
			int n;
			if (!pexp->ResolveToInteger(&n, false))
				fComplex = false;
			else
				fComplex = (n > 0);
		}
		m_vgbdy[wGid].Initialize(wGid);
		m_vgbdy[wGid].OverlayGrid(pfont, fComplex);
	}
}